

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLinkRSDA.cpp
# Opt level: O3

void __thiscall
chrono::ChLinkRSDA::IntLoadResidual_F(ChLinkRSDA *this,uint off,ChVectorDynamic<> *R,double c)

{
  long *plVar1;
  ulong *puVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  ChBodyFrame *pCVar9;
  byte bVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  undefined1 auVar17 [16];
  long lVar18;
  long lVar19;
  long lVar20;
  long lVar21;
  long lVar22;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  int iVar26;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  long lVar27;
  double *pdVar28;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  uint uVar29;
  ulong uVar30;
  uint uVar31;
  undefined4 in_register_00000034;
  ulong uVar32;
  undefined1 auVar33 [32];
  undefined1 auVar34 [64];
  undefined1 auVar35 [64];
  undefined1 auVar36 [64];
  undefined1 auVar37 [64];
  undefined1 auVar38 [64];
  long in_XMM0_Qb;
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [32];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 local_78 [16];
  long alStack_68 [2];
  double dStack_58;
  long lStack_50;
  double dStack_48;
  long lStack_40;
  double local_38;
  undefined8 uStack_30;
  double local_28;
  undefined8 uStack_20;
  
  dStack_58 = c;
  lStack_50 = in_XMM0_Qb;
  iVar26 = (*(this->super_ChLink).super_ChLinkBase.super_ChPhysicsItem.super_ChObj._vptr_ChObj[9])
                     (this,CONCAT44(in_register_00000034,off));
  if ((char)iVar26 == '\0') {
    return;
  }
  local_28 = this->m_torque;
  local_38 = local_28 * (this->m_axis).m_data[0];
  uStack_30 = 0;
  dStack_48 = local_28 * (this->m_axis).m_data[1];
  local_28 = local_28 * (this->m_axis).m_data[2];
  lStack_40 = 0;
  uStack_20 = 0;
  iVar26 = (*(((this->super_ChLink).Body1)->super_ChFrameMoving<double>).super_ChFrame<double>.
             _vptr_ChFrame[0x10])();
  if (*(char *)(CONCAT44(extraout_var,iVar26) + 0x2c) == '\0') {
    pCVar9 = (this->super_ChLink).Body1;
    auVar17._8_8_ = uStack_30;
    auVar17._0_8_ = local_38;
    auVar24._8_8_ = uStack_20;
    auVar24._0_8_ = local_28;
    auVar42._0_8_ =
         dStack_48 *
         (pCVar9->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
         super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3];
    auVar42._8_8_ =
         dStack_48 *
         (pCVar9->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
         super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4];
    auVar3._8_8_ = 0;
    auVar3._0_8_ = (pCVar9->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                   super_Matrix<double,_3,_3,_1,_3,_3>.
                   super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                   array[2];
    auVar39._8_8_ = 0;
    auVar39._0_8_ =
         dStack_48 *
         (pCVar9->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
         super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5];
    auVar17 = vfmadd231sd_fma(auVar39,auVar17,auVar3);
    auVar46._8_8_ = local_38;
    auVar46._0_8_ = local_38;
    auVar3 = vfmadd132pd_fma(auVar46,auVar42,
                             *(undefined1 (*) [16])
                              (pCVar9->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                              super_Matrix<double,_3,_3,_1,_3,_3>.
                              super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage
                              .m_data.array);
    auVar43._8_8_ = local_28;
    auVar43._0_8_ = local_28;
    auVar4._8_8_ = 0;
    auVar4._0_8_ = (pCVar9->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                   super_Matrix<double,_3,_3,_1,_3,_3>.
                   super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                   array[8];
    auVar4 = vfmadd231sd_fma(auVar17,auVar24,auVar4);
    local_78 = vfmadd132pd_fma(auVar43,auVar3,
                               *(undefined1 (*) [16])
                                ((pCVar9->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix
                                 .super_Matrix<double,_3,_3,_1,_3,_3>.
                                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                                 m_storage.m_data.array + 6));
    alStack_68[0] = auVar4._0_8_;
    iVar26 = (*(pCVar9->super_ChFrameMoving<double>).super_ChFrame<double>._vptr_ChFrame[0x10])();
    lVar27 = (long)*(int *)(CONCAT44(extraout_var_00,iVar26) + 0x30);
    if ((lVar27 < -3) ||
       ((R->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows + -3 <
        lVar27 + 3)) goto LAB_00599ee5;
    pdVar28 = (R->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data +
              lVar27 + 3;
    uVar29 = 3;
    if (((ulong)pdVar28 & 7) == 0) {
      uVar31 = -((uint)((ulong)pdVar28 >> 3) & 0x1fffffff) & 7;
      if (uVar31 < 3) {
        uVar29 = uVar31;
      }
      if (uVar31 != 0) goto LAB_00599d0e;
    }
    else {
LAB_00599d0e:
      auVar5._8_8_ = 0;
      auVar5._0_8_ = dStack_58;
      auVar34 = vbroadcastsd_avx512f(auVar5);
      auVar35 = vpbroadcastq_avx512f();
      uVar32 = vpcmpuq_avx512f(auVar35,_DAT_00965ec0,5);
      bVar10 = (byte)uVar32;
      auVar35._8_8_ = (ulong)((byte)(uVar32 >> 1) & 1) * local_78._8_8_;
      auVar35._0_8_ = (ulong)(bVar10 & 1) * local_78._0_8_;
      auVar35._16_8_ = (ulong)((byte)(uVar32 >> 2) & 1) * alStack_68[0];
      auVar35._24_8_ = (ulong)((byte)(uVar32 >> 3) & 1) * alStack_68[1];
      auVar35._32_8_ = (ulong)((byte)(uVar32 >> 4) & 1) * (long)dStack_58;
      auVar35._40_8_ = (ulong)((byte)(uVar32 >> 5) & 1) * lStack_50;
      auVar35._48_8_ = (ulong)((byte)(uVar32 >> 6) & 1) * (long)dStack_48;
      auVar35._56_8_ = (uVar32 >> 7) * lStack_40;
      auVar36._8_8_ = (ulong)((byte)(uVar32 >> 1) & 1) * (long)pdVar28[1];
      auVar36._0_8_ = (ulong)(bVar10 & 1) * (long)*pdVar28;
      auVar36._16_8_ = (ulong)((byte)(uVar32 >> 2) & 1) * (long)pdVar28[2];
      auVar36._24_8_ = (ulong)((byte)(uVar32 >> 3) & 1) * (long)pdVar28[3];
      auVar36._32_8_ = (ulong)((byte)(uVar32 >> 4) & 1) * (long)pdVar28[4];
      auVar36._40_8_ = (ulong)((byte)(uVar32 >> 5) & 1) * (long)pdVar28[5];
      auVar36._48_8_ = (ulong)((byte)(uVar32 >> 6) & 1) * (long)pdVar28[6];
      auVar36._56_8_ = (uVar32 >> 7) * (long)pdVar28[7];
      auVar34 = vmulpd_avx512f(auVar35,auVar34);
      auVar34 = vsubpd_avx512f(auVar36,auVar34);
      bVar11 = (bool)((byte)(uVar32 >> 1) & 1);
      bVar12 = (bool)((byte)(uVar32 >> 2) & 1);
      bVar13 = (bool)((byte)(uVar32 >> 3) & 1);
      bVar14 = (bool)((byte)(uVar32 >> 4) & 1);
      bVar15 = (bool)((byte)(uVar32 >> 5) & 1);
      bVar16 = (bool)((byte)(uVar32 >> 6) & 1);
      *pdVar28 = (double)((ulong)(bVar10 & 1) * auVar34._0_8_ |
                         (ulong)!(bool)(bVar10 & 1) * (long)*pdVar28);
      pdVar28[1] = (double)((ulong)bVar11 * auVar34._8_8_ | (ulong)!bVar11 * (long)pdVar28[1]);
      pdVar28[2] = (double)((ulong)bVar12 * auVar34._16_8_ | (ulong)!bVar12 * (long)pdVar28[2]);
      pdVar28[3] = (double)((ulong)bVar13 * auVar34._24_8_ | (ulong)!bVar13 * (long)pdVar28[3]);
      pdVar28[4] = (double)((ulong)bVar14 * auVar34._32_8_ | (ulong)!bVar14 * (long)pdVar28[4]);
      pdVar28[5] = (double)((ulong)bVar15 * auVar34._40_8_ | (ulong)!bVar15 * (long)pdVar28[5]);
      pdVar28[6] = (double)((ulong)bVar16 * auVar34._48_8_ | (ulong)!bVar16 * (long)pdVar28[6]);
      pdVar28[7] = (double)((uVar32 >> 7) * auVar34._56_8_ |
                           (ulong)!SUB81(uVar32 >> 7,0) * (long)pdVar28[7]);
    }
    if (uVar29 < 3) {
      uVar30 = (ulong)(uVar29 << 3);
      auVar33 = vpbroadcastq_avx512vl();
      uVar32 = vpcmpuq_avx512vl(auVar33,_DAT_00955380,5);
      uVar32 = uVar32 & 0xf;
      bVar10 = (byte)uVar32;
      plVar1 = (long *)((long)pdVar28 + uVar30);
      auVar33._8_8_ = (ulong)((byte)(uVar32 >> 1) & 1) * plVar1[1];
      auVar33._0_8_ = (ulong)(bVar10 & 1) * *plVar1;
      auVar33._16_8_ = (ulong)((byte)(uVar32 >> 2) & 1) * plVar1[2];
      auVar33._24_8_ = (uVar32 >> 3) * plVar1[3];
      auVar41._0_8_ = (double)((ulong)(bVar10 & 1) * *(long *)(local_78 + uVar30)) * dStack_58;
      auVar41._8_8_ =
           (double)((ulong)((byte)(uVar32 >> 1) & 1) * *(long *)(local_78 + uVar30 + 8)) * dStack_58
      ;
      auVar41._16_8_ =
           (double)((ulong)((byte)(uVar32 >> 2) & 1) * *(long *)((long)alStack_68 + uVar30)) *
           dStack_58;
      auVar41._24_8_ =
           (double)((uVar32 >> 3) * *(long *)((long)alStack_68 + uVar30 + 8)) * dStack_58;
      auVar33 = vsubpd_avx(auVar33,auVar41);
      puVar2 = (ulong *)((long)pdVar28 + uVar30);
      bVar11 = (bool)((byte)(uVar32 >> 1) & 1);
      bVar12 = (bool)((byte)(uVar32 >> 2) & 1);
      *puVar2 = (ulong)(bVar10 & 1) * auVar33._0_8_ | (ulong)!(bool)(bVar10 & 1) * *puVar2;
      puVar2[1] = (ulong)bVar11 * auVar33._8_8_ | (ulong)!bVar11 * puVar2[1];
      puVar2[2] = (ulong)bVar12 * auVar33._16_8_ | (ulong)!bVar12 * puVar2[2];
      puVar2[3] = (uVar32 >> 3) * auVar33._24_8_ | (ulong)!SUB81(uVar32 >> 3,0) * puVar2[3];
    }
  }
  iVar26 = (*(((this->super_ChLink).Body2)->super_ChFrameMoving<double>).super_ChFrame<double>.
             _vptr_ChFrame[0x10])();
  if (*(char *)(CONCAT44(extraout_var_01,iVar26) + 0x2c) != '\0') {
    return;
  }
  pCVar9 = (this->super_ChLink).Body2;
  auVar23._8_8_ = uStack_30;
  auVar23._0_8_ = local_38;
  auVar25._8_8_ = uStack_20;
  auVar25._0_8_ = local_28;
  auVar44._0_8_ =
       dStack_48 *
       (pCVar9->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
       super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3];
  auVar44._8_8_ =
       dStack_48 *
       (pCVar9->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
       super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4];
  auVar6._8_8_ = 0;
  auVar6._0_8_ = (pCVar9->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                 super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [2];
  auVar40._8_8_ = 0;
  auVar40._0_8_ =
       dStack_48 *
       (pCVar9->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
       super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5];
  auVar4 = vfmadd231sd_fma(auVar40,auVar23,auVar6);
  auVar47._8_8_ = local_38;
  auVar47._0_8_ = local_38;
  auVar3 = vfmadd132pd_fma(auVar47,auVar44,
                           *(undefined1 (*) [16])
                            (pCVar9->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                            super_Matrix<double,_3,_3,_1,_3,_3>.
                            super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                            m_data.array);
  auVar45._8_8_ = local_28;
  auVar45._0_8_ = local_28;
  auVar7._8_8_ = 0;
  auVar7._0_8_ = (pCVar9->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                 super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [8];
  auVar4 = vfmadd231sd_fma(auVar4,auVar25,auVar7);
  local_78 = vfmadd132pd_fma(auVar45,auVar3,
                             *(undefined1 (*) [16])
                              ((pCVar9->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                               super_Matrix<double,_3,_3,_1,_3,_3>.
                               super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                               m_storage.m_data.array + 6));
  alStack_68[0] = auVar4._0_8_;
  iVar26 = (*(pCVar9->super_ChFrameMoving<double>).super_ChFrame<double>._vptr_ChFrame[0x10])();
  lVar27 = (long)*(int *)(CONCAT44(extraout_var_02,iVar26) + 0x30);
  if ((lVar27 < -3) ||
     ((R->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows + -3 <
      lVar27 + 3)) {
LAB_00599ee5:
    __assert_fail("startRow >= 0 && blockRows >= 0 && startRow <= xpr.rows() - blockRows && startCol >= 0 && blockCols >= 0 && startCol <= xpr.cols() - blockCols"
                  ,"/usr/include/eigen3/Eigen/src/Core/Block.h",0x93,
                  "Eigen::Block<Eigen::Matrix<double, -1, 1>, -1, 1>::Block(XprType &, Index, Index, Index, Index) [XprType = Eigen::Matrix<double, -1, 1>, BlockRows = -1, BlockCols = 1, InnerPanel = false]"
                 );
  }
  pdVar28 = (R->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data +
            lVar27 + 3;
  uVar29 = 3;
  if (((ulong)pdVar28 & 7) == 0) {
    uVar31 = -((uint)((ulong)pdVar28 >> 3) & 0x1fffffff) & 7;
    if (uVar31 < 3) {
      uVar29 = uVar31;
    }
    if (uVar31 == 0) goto LAB_00599e94;
  }
  auVar8._8_8_ = 0;
  auVar8._0_8_ = dStack_58;
  auVar34 = vbroadcastsd_avx512f(auVar8);
  auVar35 = vpbroadcastq_avx512f();
  uVar32 = vpcmpuq_avx512f(auVar35,_DAT_00965ec0,5);
  bVar10 = (byte)uVar32;
  auVar37._8_8_ = (ulong)((byte)(uVar32 >> 1) & 1) * local_78._8_8_;
  auVar37._0_8_ = (ulong)(bVar10 & 1) * local_78._0_8_;
  auVar37._16_8_ = (ulong)((byte)(uVar32 >> 2) & 1) * alStack_68[0];
  auVar37._24_8_ = (ulong)((byte)(uVar32 >> 3) & 1) * alStack_68[1];
  auVar37._32_8_ = (ulong)((byte)(uVar32 >> 4) & 1) * (long)dStack_58;
  auVar37._40_8_ = (ulong)((byte)(uVar32 >> 5) & 1) * lStack_50;
  auVar37._48_8_ = (ulong)((byte)(uVar32 >> 6) & 1) * (long)dStack_48;
  auVar37._56_8_ = (uVar32 >> 7) * lStack_40;
  auVar38._8_8_ = (ulong)((byte)(uVar32 >> 1) & 1) * (long)pdVar28[1];
  auVar38._0_8_ = (ulong)(bVar10 & 1) * (long)*pdVar28;
  auVar38._16_8_ = (ulong)((byte)(uVar32 >> 2) & 1) * (long)pdVar28[2];
  auVar38._24_8_ = (ulong)((byte)(uVar32 >> 3) & 1) * (long)pdVar28[3];
  auVar38._32_8_ = (ulong)((byte)(uVar32 >> 4) & 1) * (long)pdVar28[4];
  auVar38._40_8_ = (ulong)((byte)(uVar32 >> 5) & 1) * (long)pdVar28[5];
  auVar38._48_8_ = (ulong)((byte)(uVar32 >> 6) & 1) * (long)pdVar28[6];
  auVar38._56_8_ = (uVar32 >> 7) * (long)pdVar28[7];
  auVar34 = vmulpd_avx512f(auVar37,auVar34);
  auVar34 = vaddpd_avx512f(auVar34,auVar38);
  bVar11 = (bool)((byte)(uVar32 >> 1) & 1);
  bVar12 = (bool)((byte)(uVar32 >> 2) & 1);
  bVar13 = (bool)((byte)(uVar32 >> 3) & 1);
  bVar14 = (bool)((byte)(uVar32 >> 4) & 1);
  bVar15 = (bool)((byte)(uVar32 >> 5) & 1);
  bVar16 = (bool)((byte)(uVar32 >> 6) & 1);
  *pdVar28 = (double)((ulong)(bVar10 & 1) * auVar34._0_8_ |
                     (ulong)!(bool)(bVar10 & 1) * (long)*pdVar28);
  pdVar28[1] = (double)((ulong)bVar11 * auVar34._8_8_ | (ulong)!bVar11 * (long)pdVar28[1]);
  pdVar28[2] = (double)((ulong)bVar12 * auVar34._16_8_ | (ulong)!bVar12 * (long)pdVar28[2]);
  pdVar28[3] = (double)((ulong)bVar13 * auVar34._24_8_ | (ulong)!bVar13 * (long)pdVar28[3]);
  pdVar28[4] = (double)((ulong)bVar14 * auVar34._32_8_ | (ulong)!bVar14 * (long)pdVar28[4]);
  pdVar28[5] = (double)((ulong)bVar15 * auVar34._40_8_ | (ulong)!bVar15 * (long)pdVar28[5]);
  pdVar28[6] = (double)((ulong)bVar16 * auVar34._48_8_ | (ulong)!bVar16 * (long)pdVar28[6]);
  pdVar28[7] = (double)((uVar32 >> 7) * auVar34._56_8_ |
                       (ulong)!SUB81(uVar32 >> 7,0) * (long)pdVar28[7]);
LAB_00599e94:
  if (uVar29 < 3) {
    uVar30 = (ulong)(uVar29 << 3);
    auVar33 = vpbroadcastq_avx512vl();
    uVar32 = vpcmpuq_avx512vl(auVar33,_DAT_00955380,5);
    uVar32 = uVar32 & 0xf;
    lVar27 = *(long *)(local_78 + uVar30 + 8);
    lVar18 = *(long *)((long)alStack_68 + uVar30);
    lVar19 = *(long *)((long)alStack_68 + uVar30 + 8);
    bVar10 = (byte)uVar32;
    plVar1 = (long *)((long)pdVar28 + uVar30);
    lVar20 = plVar1[1];
    lVar21 = plVar1[2];
    lVar22 = plVar1[3];
    puVar2 = (ulong *)((long)pdVar28 + uVar30);
    bVar11 = (bool)((byte)(uVar32 >> 1) & 1);
    bVar12 = (bool)((byte)(uVar32 >> 2) & 1);
    *puVar2 = (ulong)(bVar10 & 1) *
              (long)((double)((ulong)(bVar10 & 1) * *(long *)(local_78 + uVar30)) * dStack_58 +
                    (double)((ulong)(bVar10 & 1) * *plVar1)) | (ulong)!(bool)(bVar10 & 1) * *puVar2;
    puVar2[1] = (ulong)bVar11 *
                (long)((double)((ulong)((byte)(uVar32 >> 1) & 1) * lVar27) * dStack_58 +
                      (double)((ulong)((byte)(uVar32 >> 1) & 1) * lVar20)) |
                (ulong)!bVar11 * puVar2[1];
    puVar2[2] = (ulong)bVar12 *
                (long)((double)((ulong)((byte)(uVar32 >> 2) & 1) * lVar18) * dStack_58 +
                      (double)((ulong)((byte)(uVar32 >> 2) & 1) * lVar21)) |
                (ulong)!bVar12 * puVar2[2];
    puVar2[3] = (uVar32 >> 3) *
                (long)((double)((uVar32 >> 3) * lVar19) * dStack_58 +
                      (double)((uVar32 >> 3) * lVar22)) | (ulong)!SUB81(uVar32 >> 3,0) * puVar2[3];
  }
  return;
}

Assistant:

void ChLinkRSDA::IntLoadResidual_F(const unsigned int off, ChVectorDynamic<>& R, const double c) {
    if (!IsActive())
        return;

    // Applied torque in absolute frame
    ChVector<> torque = m_torque * m_axis;

    // Load torques in 'R' vector accumulator (torques in local coords)
    if (Body1->Variables().IsActive()) {
        R.segment(Body1->Variables().GetOffset() + 3, 3) -= c * Body1->TransformDirectionParentToLocal(torque).eigen();
    }
    if (Body2->Variables().IsActive()) {
        R.segment(Body2->Variables().GetOffset() + 3, 3) += c * Body2->TransformDirectionParentToLocal(torque).eigen();
    }
}